

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_impl.c
# Opt level: O0

log_aspect_interface log_impl_aspect_interface(log_aspect_id aspect_id)

{
  log_aspect_interface plVar1;
  uint in_EDI;
  
  plVar1 = (*log_impl_aspect_interface::aspect_impl[in_EDI])();
  return plVar1;
}

Assistant:

log_aspect_interface log_impl_aspect_interface(enum log_aspect_id aspect_id)
{
	static log_aspect_singleton aspect_impl[LOG_ASPECT_SIZE] = {
		&log_aspect_format_interface,
		&log_aspect_schedule_interface,
		&log_aspect_storage_interface,
		&log_aspect_stream_interface
	};

	return aspect_impl[aspect_id]();
}